

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O2

bool __thiscall Process::Converter::checkValue(Converter *this,string *s)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool bVar4;
  Converter *this_00;
  string *v;
  pointer __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = (Converter *)s;
  bVar2 = std::operator==(s,"UWUAC");
  bVar4 = true;
  if (!bVar2) {
    bVar2 = isChar(this_00,s);
    if ((bVar2) || (bVar2 = isNb(this_00,s), bVar2)) {
      bVar2 = isNb(this_00,s);
      if (!bVar2) {
        __rhs = (this->_contVar).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (this->_contVar).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (__rhs == pbVar1) {
            std::operator+(&local_48,"The value : ",s);
            std::operator+(&bStack_68,&local_48," is undefined!");
            error(this,&bStack_68);
            goto LAB_00107467;
          }
          _Var3 = std::operator==(s,__rhs);
          __rhs = __rhs + 1;
        } while (!_Var3);
      }
    }
    else {
      std::operator+(&local_48,"The value : ",s);
      std::operator+(&bStack_68,&local_48," is not handled!");
      error(this,&bStack_68);
LAB_00107467:
      std::__cxx11::string::~string((string *)&bStack_68);
      std::__cxx11::string::~string((string *)&local_48);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Converter::checkValue(const std::string &s)
    {
        if (s == "UWUAC")
            return true;
        if (!isChar(s)
        && !isNb(s))
            return error("The value : " + s + " is not handled!");

        if (isNb(s))
            return true;

        for (const std::string &v : _contVar)
            if (s == v)
                return true;
        return error("The value : " + s + " is undefined!");
    }